

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_gradient_radial_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float density,rf_color inner,
          rf_color outer,rf_color *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  float fVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  int iVar10;
  rf_color *prVar11;
  long lVar12;
  long lVar13;
  short sVar14;
  float fVar15;
  rf_color rVar17;
  undefined1 auVar19 [16];
  float fVar20;
  float fStack_64;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar16;
  undefined6 uVar18;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      iVar10 = height;
      if (width < height) {
        iVar10 = width;
      }
      auVar8[0xc] = outer.a;
      auVar8._0_12_ = ZEXT712(0);
      auVar9[0xc] = inner.a;
      auVar9._0_12_ = ZEXT712(0);
      fVar7 = (float)((uint)inner >> 8 & 0xff);
      lVar12 = 0;
      prVar11 = dst;
      do {
        if (0 < width) {
          lVar13 = 0;
          do {
            fVar15 = hypotf((float)lVar13 - (float)width * 0.5,(float)lVar12 - (float)height * 0.5);
            fStack_64 = (float)(CONCAT17((char)((uint)fVar7 >> 0x18),
                                         CONCAT16((char)((uint)fVar7 >> 0x10),
                                                  CONCAT15((char)((uint)fVar7 >> 8),
                                                           CONCAT14(SUB41(fVar7,0),
                                                                    (float)((uint)inner & 0xff)))))
                               >> 0x20);
            fVar15 = (fVar15 + -((float)iVar10 * 0.5) * density) /
                     ((1.0 - density) * (float)iVar10 * 0.5);
            if (fVar15 <= 0.0) {
              fVar15 = 0.0;
            }
            if (1.0 <= fVar15) {
              fVar15 = 1.0;
            }
            fVar20 = 1.0 - fVar15;
            auVar19._0_4_ =
                 (int)(fVar15 * (float)((uint)outer & 0xff) + fVar20 * (float)((uint)inner & 0xff));
            auVar19._4_4_ = (int)(fVar15 * (float)((uint)outer >> 8 & 0xff) + fVar20 * fStack_64);
            auVar19._8_4_ =
                 (int)(fVar15 * (float)(int)CONCAT32(auVar8._10_3_,(ushort)outer.b) +
                      fVar20 * (float)(int)CONCAT32(auVar9._10_3_,(ushort)inner.b));
            auVar19._12_4_ = (int)(fVar15 * (float)outer.a + fVar20 * (float)inner.a);
            auVar19 = auVar19 & _DAT_00177d80;
            sVar5 = auVar19._0_2_;
            cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar19[0] - (0xff < sVar5);
            sVar5 = auVar19._2_2_;
            sVar14 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar19[2] - (0xff < sVar5),cVar1);
            sVar5 = auVar19._4_2_;
            cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar19[4] - (0xff < sVar5);
            sVar5 = auVar19._6_2_;
            uVar16 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar19[6] - (0xff < sVar5),
                              CONCAT12(cVar2,sVar14));
            sVar5 = auVar19._8_2_;
            cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar19[8] - (0xff < sVar5);
            sVar5 = auVar19._10_2_;
            uVar18 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar19[10] - (0xff < sVar5),
                              CONCAT14(cVar3,uVar16));
            sVar5 = auVar19._12_2_;
            cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar19[0xc] - (0xff < sVar5);
            sVar6 = auVar19._14_2_;
            sVar5 = (short)((uint)uVar16 >> 0x10);
            rVar17.g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
            rVar17.r = (0 < sVar14) * (sVar14 < 0x100) * cVar1 - (0xff < sVar14);
            sVar5 = (short)((uint6)uVar18 >> 0x20);
            rVar17.b = (0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5);
            sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar19[0xe] - (0xff < sVar6),
                                     CONCAT16(cVar4,uVar18)) >> 0x30);
            rVar17.a = (0 < sVar5) * (sVar5 < 0x100) * cVar4 - (0xff < sVar5);
            prVar11[lVar13] = rVar17;
            lVar13 = lVar13 + 1;
          } while (width != lVar13);
        }
        lVar12 = lVar12 + 1;
        prVar11 = prVar11 + width;
      } while (lVar12 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_radial_to_buffer(int width, int height, float density, rf_color inner, rf_color outer, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float dist   = hypotf((float)x - center_x, (float)y - center_y);
                float factor = (dist - radius * density) / (radius * (1.0f - density));

                factor = (float)fmax(factor, 0.f);
                factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

                dst[y * width + x].r = (int)((float)outer.r * factor + (float)inner.r * (1.0f - factor));
                dst[y * width + x].g = (int)((float)outer.g * factor + (float)inner.g * (1.0f - factor));
                dst[y * width + x].b = (int)((float)outer.b * factor + (float)inner.b * (1.0f - factor));
                dst[y * width + x].a = (int)((float)outer.a * factor + (float)inner.a * (1.0f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}